

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsysTestsC.c
# Opt level: O3

int main(int ac,char **av)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  clock_t cVar6;
  clock_t cVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  int testNum;
  char **local_48;
  uint local_38;
  uint local_34;
  
  local_38 = 0;
  uVar8 = 0xffffffff;
  local_48 = av;
  if (ac < 2) {
    puts("Available tests:");
    printf("%3d. %s\n",0,"testEncode");
    printf("%3d. %s\n",1,"testTerminal");
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar3 = __isoc99_scanf("%d",&local_38);
    if (iVar3 != 1) {
      pcVar10 = "Couldn\'t parse that input as a number";
      goto LAB_0010236e;
    }
    if (1 < (int)local_38) {
      pcVar10 = "%3d is an invalid test number.\n";
      goto LAB_001024c8;
    }
    ac = ac - 1;
    local_48 = av + 1;
    uVar8 = local_38;
  }
  if (ac < 2 || uVar8 != 0xffffffff) {
    if (uVar8 == 0xffffffff) {
      bVar12 = false;
      local_34 = 0;
      goto LAB_0010240c;
    }
  }
  else {
    pcVar10 = local_48[1];
    bVar12 = false;
    local_34 = 0;
    if (*pcVar10 == '-') {
      local_34 = 0;
      bVar12 = false;
      if (pcVar10[1] == 'R') {
        bVar12 = pcVar10[2] == '\0';
        if (bVar12 && (uint)ac < 3) {
          pcVar10 = "-R needs an additional parameter.";
LAB_0010236e:
          puts(pcVar10);
          return -1;
        }
        local_34 = (uint)(pcVar10[2] == '\0');
      }
      if ((pcVar10[1] == 'A') && (pcVar10[2] == '\0')) {
        puts("TAP version 13");
        printf("1..%d\n",2);
        lVar11 = 0;
        do {
          pcVar10 = cmakeGeneratedFunctionMapEntries[lVar11].name;
          if (2 < (uint)ac) {
            uVar9 = 0;
            do {
              iVar3 = strcmp(pcVar10,local_48[uVar9 + 2]);
              if (iVar3 == 0) {
                printf("ok %d %s # SKIP\n",lVar11 + 1U & 0xffffffff,pcVar10);
                goto LAB_0010262f;
              }
              uVar9 = uVar9 + 1;
            } while (ac - 2 != uVar9);
          }
          cVar6 = clock();
          iVar3 = (*cmakeGeneratedFunctionMapEntries[lVar11].func)(ac,local_48);
          cVar7 = clock();
          pcVar4 = "ok";
          if (iVar3 == -1) {
            pcVar4 = "not ok";
          }
          printf("%s %d %s # %f\n",(double)(cVar7 - cVar6) / 1000000.0,pcVar4,
                 lVar11 + 1U & 0xffffffff,pcVar10);
LAB_0010262f:
          bVar12 = lVar11 != 0;
          lVar11 = lVar11 + 1;
          if (bVar12) {
            puts("All tests finished.");
            return 0;
          }
        } while( true );
      }
    }
LAB_0010240c:
    pcVar10 = lowercase(local_48[(ulong)local_34 + 1]);
    bVar2 = 1;
    lVar11 = 0;
    do {
      pcVar4 = lowercase(cmakeGeneratedFunctionMapEntries[lVar11].name);
      if ((bVar12) && (pcVar5 = strstr(pcVar4,pcVar10), pcVar5 != (char *)0x0)) {
        ac = ac - 2;
        local_48 = local_48 + 2;
      }
      else if ((local_34 == 0) && (iVar3 = strcmp(pcVar4,pcVar10), iVar3 == 0)) {
        ac = ac - 1;
        local_48 = local_48 + 1;
      }
      else {
        lVar11 = 0xffffffff;
      }
      free(pcVar4);
      uVar8 = (uint)lVar11;
      lVar11 = 1;
      bVar1 = (bool)(uVar8 == 0xffffffff & bVar2);
      bVar2 = 0;
    } while (bVar1);
    free(pcVar10);
    if (uVar8 == 0xffffffff) {
      puts("Available tests:");
      printf("%3d. %s\n",0,"testEncode");
      printf("%3d. %s\n",1,"testTerminal");
      printf("Failed: %s is an invalid test name.\n",local_48[1]);
      return -1;
    }
  }
  if (uVar8 < 2) {
    iVar3 = (*cmakeGeneratedFunctionMapEntries[uVar8].func)(ac,local_48);
    return iVar3;
  }
  pcVar10 = "testToRun was modified by TestDriver code to an invalid value: %3d.\n";
LAB_001024c8:
  printf(pcVar10,(ulong)local_38);
  return -1;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}